

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O1

ResolvedTrace * __thiscall
backward::TraceResolverImplBase::resolve
          (ResolvedTrace *__return_storage_ptr__,TraceResolverImplBase *this,ResolvedTrace *t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_t sVar3;
  undefined8 uVar4;
  pointer pSVar5;
  uint uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  
  sVar3 = (t->super_Trace).idx;
  (__return_storage_ptr__->super_Trace).addr = (t->super_Trace).addr;
  (__return_storage_ptr__->super_Trace).idx = sVar3;
  paVar1 = &(__return_storage_ptr__->object_filename).field_2;
  (__return_storage_ptr__->object_filename)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (t->object_filename)._M_dataplus._M_p;
  paVar7 = &(t->object_filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar7) {
    uVar4 = *(undefined8 *)((long)&(t->object_filename).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->object_filename).field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->object_filename)._M_dataplus._M_p = pcVar2;
    (__return_storage_ptr__->object_filename).field_2._M_allocated_capacity =
         paVar7->_M_allocated_capacity;
  }
  (__return_storage_ptr__->object_filename)._M_string_length = (t->object_filename)._M_string_length
  ;
  (t->object_filename)._M_dataplus._M_p = (pointer)paVar7;
  (t->object_filename)._M_string_length = 0;
  (t->object_filename).field_2._M_local_buf[0] = '\0';
  paVar1 = &(__return_storage_ptr__->object_function).field_2;
  (__return_storage_ptr__->object_function)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (t->object_function)._M_dataplus._M_p;
  paVar7 = &(t->object_function).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar7) {
    uVar4 = *(undefined8 *)((long)&(t->object_function).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->object_function).field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->object_function)._M_dataplus._M_p = pcVar2;
    (__return_storage_ptr__->object_function).field_2._M_allocated_capacity =
         paVar7->_M_allocated_capacity;
  }
  (__return_storage_ptr__->object_function)._M_string_length = (t->object_function)._M_string_length
  ;
  (t->object_function)._M_dataplus._M_p = (pointer)paVar7;
  (t->object_function)._M_string_length = 0;
  (t->object_function).field_2._M_local_buf[0] = '\0';
  paVar1 = &(__return_storage_ptr__->source).function.field_2;
  (__return_storage_ptr__->source).function._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (t->source).function._M_dataplus._M_p;
  paVar7 = &(t->source).function.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar7) {
    uVar4 = *(undefined8 *)((long)&(t->source).function.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->source).function.field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->source).function._M_dataplus._M_p = pcVar2;
    (__return_storage_ptr__->source).function.field_2._M_allocated_capacity =
         paVar7->_M_allocated_capacity;
  }
  (__return_storage_ptr__->source).function._M_string_length = (t->source).function._M_string_length
  ;
  (t->source).function._M_dataplus._M_p = (pointer)paVar7;
  (t->source).function._M_string_length = 0;
  (t->source).function.field_2._M_local_buf[0] = '\0';
  paVar1 = &(__return_storage_ptr__->source).filename.field_2;
  (__return_storage_ptr__->source).filename._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (t->source).filename._M_dataplus._M_p;
  paVar7 = &(t->source).filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar7) {
    uVar4 = *(undefined8 *)((long)&(t->source).filename.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->source).filename.field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->source).filename._M_dataplus._M_p = pcVar2;
    (__return_storage_ptr__->source).filename.field_2._M_allocated_capacity =
         paVar7->_M_allocated_capacity;
  }
  (__return_storage_ptr__->source).filename._M_string_length = (t->source).filename._M_string_length
  ;
  (t->source).filename._M_dataplus._M_p = (pointer)paVar7;
  (t->source).filename._M_string_length = 0;
  (t->source).filename.field_2._M_local_buf[0] = '\0';
  uVar6 = (t->source).col;
  (__return_storage_ptr__->source).line = (t->source).line;
  (__return_storage_ptr__->source).col = uVar6;
  pSVar5 = (t->inliners).
           super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->inliners).
  super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (t->inliners).
       super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->inliners).
  super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar5;
  (__return_storage_ptr__->inliners).
  super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (t->inliners).
       super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (t->inliners).
  super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (t->inliners).
  super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (t->inliners).
  super__Vector_base<backward::ResolvedTrace::SourceLoc,_std::allocator<backward::ResolvedTrace::SourceLoc>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

virtual ResolvedTrace resolve(ResolvedTrace t) { return t; }